

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AvoidReinterprets.cpp
# Opt level: O1

Pass * wasm::createAvoidReinterpretsPass(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Pass *__s;
  
  __s = (Pass *)operator_new(0x140);
  memset(__s,0,0x140);
  __s->runner = (PassRunner *)0x0;
  (__s->name)._M_dataplus._M_p = (pointer)&(__s->name).field_2;
  (__s->name)._M_string_length = 0;
  (__s->name).field_2._M_local_buf[0] = '\0';
  __s[1]._vptr_Pass = (_func_int **)0x0;
  __s[1].runner = (PassRunner *)0x0;
  __s[4].name.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&__s[4].name.field_2 + 8) = 0;
  __s[5]._vptr_Pass = (_func_int **)0x0;
  __s[5].runner = (PassRunner *)0x0;
  __s[5].name._M_dataplus._M_p = (pointer)0x0;
  __s->_vptr_Pass = (_func_int **)&PTR__AvoidReinterprets_00d87bd8;
  paVar1 = &__s[5].name.field_2;
  *(undefined4 *)&__s[5].name.field_2 = 0;
  *(undefined8 *)((long)&__s[5].name.field_2 + 8) = 0;
  __s[6]._vptr_Pass = (_func_int **)paVar1;
  __s[6].runner = (PassRunner *)paVar1;
  __s[6].name._M_dataplus._M_p = (pointer)0x0;
  return __s;
}

Assistant:

Pass* createAvoidReinterpretsPass() { return new AvoidReinterprets(); }